

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

void __thiscall
ON_SectionStyle::SetBackgroundFillColor(ON_SectionStyle *this,ON_Color *color,bool print)

{
  uint uVar1;
  uint uVar2;
  ON_SectionStylePrivate *this_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_20;
  byte local_19;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paStack_18;
  bool print_local;
  ON_Color *color_local;
  ON_SectionStyle *this_local;
  
  local_19 = print;
  paStack_18 = &color->field_0;
  color_local = (ON_Color *)this;
  local_20 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,print);
  uVar1 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_20);
  uVar2 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)paStack_18);
  if (uVar1 != uVar2) {
    if (this->m_private == (ON_SectionStylePrivate *)0x0) {
      this_00 = (ON_SectionStylePrivate *)operator_new(0x50);
      memset(this_00,0,0x50);
      ON_SectionStylePrivate::ON_SectionStylePrivate(this_00);
      this->m_private = this_00;
    }
    if ((local_19 & 1) == 0) {
      (this->m_private->m_background_fill_color).field_0 = *paStack_18;
    }
    else {
      (this->m_private->m_background_fill_print_color).field_0 = *paStack_18;
    }
  }
  return;
}

Assistant:

void ON_SectionStyle::SetBackgroundFillColor(const ON_Color& color, bool print)
{
  if (BackgroundFillColor(print) == color)
    return;
  if (nullptr == m_private)
    m_private = new ON_SectionStylePrivate();

  if (print)
    m_private->m_background_fill_print_color = color;
  else
    m_private->m_background_fill_color = color;
}